

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_emulsify(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *in_RCX;
  int in_EDX;
  int in_R8D;
  float ddice;
  int dam;
  CHAR_DATA *victim;
  undefined1 in_stack_00001322;
  undefined1 in_stack_00001323;
  int in_stack_00001324;
  int in_stack_00001328;
  int in_stack_0000132c;
  CHAR_DATA *in_stack_00001330;
  CHAR_DATA *in_stack_00001338;
  int in_stack_00001358;
  int in_stack_00001360;
  char *in_stack_00001368;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  
  dice(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  saves_spell(in_EDX,in_RCX,in_R8D);
  act(in_stack_ffffffffffffffc0,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
      (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
      (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  act(in_stack_ffffffffffffffc0,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
      (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
      (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  damage_new(in_stack_00001338,in_stack_00001330,in_stack_0000132c,in_stack_00001328,
             in_stack_00001324,(bool)in_stack_00001323,(bool)in_stack_00001322,in_stack_00001358,
             in_stack_00001360,in_stack_00001368);
  return;
}

Assistant:

void spell_emulsify(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam;
	float ddice = 1.5 * level;
	dam = dice((int)ddice, 3);

	if (saves_spell(level, victim, DAM_INTERNAL))
		dam /= 2;

	act("$n writhes in agony as $s midsection suddenly distends.", victim, 0, 0, TO_ROOM);
	act("Your insides twist with pain, as your organs begin to dissolve into viscous pools.", ch, 0, victim, TO_VICT);

	damage_new(ch, victim, dam, sn, DAM_INTERNAL, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "emulsification");
}